

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  Context *context_local;
  FunctionalTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"program_pipelines_functional",
             "Program Pipeline Objects Functional Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest_0323f6f8;
  this->m_fbo = 0;
  this->m_rbo = 0;
  this->m_vao = 0;
  this->m_spo_v = 0;
  this->m_spo_f = 0;
  this->m_ppo = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "program_pipelines_functional", "Program Pipeline Objects Functional Test")
	, m_fbo(0)
	, m_rbo(0)
	, m_vao(0)
	, m_spo_v(0)
	, m_spo_f(0)
	, m_ppo(0)
{
	/* Intentionally left blank. */
}